

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O0

ostream * vkt::(anonymous_namespace)::operator<<(ostream *str,PrettySize<unsigned_long> *size)

{
  unsigned_long uVar1;
  deUint64 dVar2;
  SizeUnit *pSVar3;
  ostream *poVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string local_1c8 [32];
  int local_1a8;
  ostringstream local_198 [8];
  ostringstream tmp;
  SizeUnit *unit;
  PrettySize<unsigned_long> *size_local;
  ostream *str_local;
  
  pSVar3 = vkt::anon_unknown_0::getBestSizeUnit(size->value);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar4 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  local_1a8 = (int)std::setprecision(size->precision);
  poVar4 = std::operator<<(poVar4,(_Setprecision)local_1a8);
  uVar1 = size->value;
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  dVar2 = pSVar3->value;
  auVar6._8_4_ = (int)(dVar2 >> 0x20);
  auVar6._0_8_ = dVar2;
  auVar6._12_4_ = 0x45300000;
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                             ((auVar6._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)dVar2) - 4503599627370496.0)));
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,pSVar3->name);
  std::__cxx11::ostringstream::str();
  poVar4 = std::operator<<(str,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return poVar4;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const PrettySize<SizeType>& size)
{
	const SizeUnit*		unit = getBestSizeUnit(deUint64(size.value));
	std::ostringstream	tmp;

	tmp << std::fixed << std::setprecision(size.precision)
		<< (double(size.value) / double(unit->value))
		<< " " << unit->name;

	return str << tmp.str();
}